

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * __thiscall
despot::util::tinyxml::TiXmlComment::Parse
          (TiXmlComment *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  bool bVar1;
  TiXmlDocument *this_00;
  char *now;
  TiXmlCursor *pTVar2;
  size_t sVar3;
  byte local_51;
  char *endTag;
  char *startTag;
  TiXmlDocument *document;
  TiXmlEncoding encoding_local;
  TiXmlParsingData *data_local;
  char *p_local;
  TiXmlComment *this_local;
  
  this_00 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  TiXmlString::operator=(&(this->super_TiXmlNode).value,"");
  now = TiXmlBase::SkipWhiteSpace(p,encoding);
  if (data != (TiXmlParsingData *)0x0) {
    TiXmlParsingData::Stamp(data,now,encoding);
    pTVar2 = TiXmlParsingData::Cursor(data);
    (this->super_TiXmlNode).super_TiXmlBase.location = *pTVar2;
  }
  bVar1 = TiXmlBase::StringEqual(now,"<!--",false,encoding);
  if (bVar1) {
    sVar3 = strlen("<!--");
    data_local = (TiXmlParsingData *)(now + sVar3);
    TiXmlString::operator=(&(this->super_TiXmlNode).value,"");
    while( true ) {
      local_51 = 0;
      if ((data_local != (TiXmlParsingData *)0x0) &&
         (local_51 = 0, (char)(data_local->cursor).row != '\0')) {
        bVar1 = TiXmlBase::StringEqual((char *)data_local,"-->",false,encoding);
        local_51 = bVar1 ^ 0xff;
      }
      if ((local_51 & 1) == 0) break;
      TiXmlString::append(&(this->super_TiXmlNode).value,(char *)data_local,1);
      data_local = (TiXmlParsingData *)((long)&(data_local->cursor).row + 1);
    }
    if (data_local != (TiXmlParsingData *)0x0) {
      sVar3 = strlen("-->");
      data_local = (TiXmlParsingData *)((long)&(data_local->cursor).row + sVar3);
    }
    this_local = (TiXmlComment *)data_local;
  }
  else {
    TiXmlDocument::SetError(this_00,0xb,now,data,encoding);
    this_local = (TiXmlComment *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* TiXmlComment::Parse(const char* p, TiXmlParsingData* data,
	TiXmlEncoding encoding) {
	TiXmlDocument* document = GetDocument();
	value = "";

	p = SkipWhiteSpace(p, encoding);

	if (data) {
		data->Stamp(p, encoding);
		location = data->Cursor();
	}
	const char* startTag = "<!--";
	const char* endTag = "-->";

	if (!StringEqual(p, startTag, false, encoding)) {
		document->SetError(TIXML_ERROR_PARSING_COMMENT, p, data, encoding);
		return 0;
	}
	p += strlen(startTag);

	// [ 1475201 ] TinyXML parses entities in comments
	// Oops - ReadText doesn't work, because we don't want to parse the entities.
	// p = ReadText( p, &value, false, endTag, false, encoding );
	//
	// from the XML spec:
	/*
	 [Definition: Comments may appear anywhere in a document outside other markup; in addition,
	 they may appear within the document type declaration at places allowed by the grammar.
	 They are not part of the document's character data; an XML processor MAY, but need not,
	 make it possible for an application to retrieve the text of comments. For compatibility,
	 the string "--" (double-hyphen) MUST NOT occur within comments.] Parameter entity
	 references MUST NOT be recognized within comments.

	 An example of a comment:

	 <!-- declarations for <head> & <body> -->
	 */

	value = "";
	// Keep all the white space.
	while (p && *p && !StringEqual(p, endTag, false, encoding)) {
		value.append(p, 1);
		++p;
	}
	if (p)
		p += strlen(endTag);

	return p;
}